

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall
QPDF::writeJSON(QPDF *this,int version,Pipeline *p,qpdf_stream_decode_level_e decode_level,
               qpdf_json_stream_data_e json_stream_data,string *file_prefix,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *wanted_objects)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  bool local_31;
  string *psStack_30;
  bool first;
  string *file_prefix_local;
  qpdf_json_stream_data_e json_stream_data_local;
  qpdf_stream_decode_level_e decode_level_local;
  Pipeline *p_local;
  QPDF *pQStack_10;
  int version_local;
  QPDF *this_local;
  
  local_31 = true;
  psStack_30 = file_prefix;
  file_prefix_local._0_4_ = json_stream_data;
  file_prefix_local._4_4_ = decode_level;
  _json_stream_data_local = p;
  p_local._4_4_ = version;
  pQStack_10 = this;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&local_68,wanted_objects);
  writeJSON(this,version,p,true,&local_31,decode_level,json_stream_data,file_prefix,&local_68);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&local_68);
  return;
}

Assistant:

void
QPDF::writeJSON(
    int version,
    Pipeline* p,
    qpdf_stream_decode_level_e decode_level,
    qpdf_json_stream_data_e json_stream_data,
    std::string const& file_prefix,
    std::set<std::string> wanted_objects)
{
    bool first = true;
    writeJSON(version, p, true, first, decode_level, json_stream_data, file_prefix, wanted_objects);
}